

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall gl4cts::EnhancedLayouts::Utils::Program::Release(Program *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar2;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_id != 0) {
    (**(code **)(lVar2 + 0x1680))(0);
    err = (**(code **)(lVar2 + 0x800))();
    glu::checkError(err,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0xbcb);
    (**(code **)(lVar2 + 0x448))(this->m_id);
    this->m_id = 0;
  }
  if ((this->m_compute).m_id != 0) {
    iVar1 = (*((this->m_compute).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x470))((this->m_compute).m_id);
    (this->m_compute).m_id = 0;
  }
  if ((this->m_fragment).m_id != 0) {
    iVar1 = (*((this->m_fragment).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x470))((this->m_fragment).m_id);
    (this->m_fragment).m_id = 0;
  }
  if ((this->m_geometry).m_id != 0) {
    iVar1 = (*((this->m_geometry).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_02,iVar1) + 0x470))((this->m_geometry).m_id);
    (this->m_geometry).m_id = 0;
  }
  if ((this->m_tess_ctrl).m_id != 0) {
    iVar1 = (*((this->m_tess_ctrl).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_03,iVar1) + 0x470))((this->m_tess_ctrl).m_id);
    (this->m_tess_ctrl).m_id = 0;
  }
  if ((this->m_tess_eval).m_id != 0) {
    iVar1 = (*((this->m_tess_eval).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_04,iVar1) + 0x470))((this->m_tess_eval).m_id);
    (this->m_tess_eval).m_id = 0;
  }
  if ((this->m_vertex).m_id != 0) {
    iVar1 = (*((this->m_vertex).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_05,iVar1) + 0x470))((this->m_vertex).m_id);
    (this->m_vertex).m_id = 0;
  }
  return;
}

Assistant:

void Program::Release()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_invalid_id != m_id)
	{
		Use(gl, m_invalid_id);

		gl.deleteProgram(m_id);
		m_id = m_invalid_id;
	}

	m_compute.Release();
	m_fragment.Release();
	m_geometry.Release();
	m_tess_ctrl.Release();
	m_tess_eval.Release();
	m_vertex.Release();
}